

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void aom_scaled_2d_c(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                    InterpKernel *filter,int x0_q4,int x_step_q4,int y0_q4,int y_step_q4,int w,int h
                    )

{
  int intermediate_height;
  uint8_t temp [8640];
  int in_stack_ffffffffffffde0c;
  InterpKernel *in_stack_ffffffffffffde10;
  ptrdiff_t in_stack_ffffffffffffde18;
  uint8_t *in_stack_ffffffffffffde20;
  ptrdiff_t in_stack_ffffffffffffde28;
  uint8_t *in_stack_ffffffffffffde30;
  int in_stack_ffffffffffffde40;
  int in_stack_ffffffffffffde48;
  int in_stack_ffffffffffffde50;
  
  convolve_horiz(in_stack_ffffffffffffde30,in_stack_ffffffffffffde28,in_stack_ffffffffffffde20,
                 in_stack_ffffffffffffde18,in_stack_ffffffffffffde10,in_stack_ffffffffffffde0c,
                 in_stack_ffffffffffffde40,in_stack_ffffffffffffde48,in_stack_ffffffffffffde50);
  convolve_vert(in_stack_ffffffffffffde30,in_stack_ffffffffffffde28,in_stack_ffffffffffffde20,
                in_stack_ffffffffffffde18,in_stack_ffffffffffffde10,in_stack_ffffffffffffde0c,
                in_stack_ffffffffffffde40,in_stack_ffffffffffffde48,in_stack_ffffffffffffde50);
  return;
}

Assistant:

void aom_scaled_2d_c(const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
                     ptrdiff_t dst_stride, const InterpKernel *filter,
                     int x0_q4, int x_step_q4, int y0_q4, int y_step_q4, int w,
                     int h) {
  // Note: Fixed size intermediate buffer, temp, places limits on parameters.
  // 2d filtering proceeds in 2 steps:
  //   (1) Interpolate horizontally into an intermediate buffer, temp.
  //   (2) Interpolate temp vertically to derive the sub-pixel result.
  // Deriving the maximum number of rows in the temp buffer (135):
  // --Smallest scaling factor is x1/2 ==> y_step_q4 = 32 (Normative).
  // --Largest block size is 64x64 pixels.
  // --64 rows in the downscaled frame span a distance of (64 - 1) * 32 in the
  //   original frame (in 1/16th pixel units).
  // --Must round-up because block may be located at sub-pixel position.
  // --Require an additional SUBPEL_TAPS rows for the 8-tap filter tails.
  // --((64 - 1) * 32 + 15) >> 4 + 8 = 135.
  // When calling in frame scaling function, the smallest scaling factor is x1/4
  // ==> y_step_q4 = 64. Since w and h are at most 16, the temp buffer is still
  // big enough.
  uint8_t temp[64 * 135];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= 64);
  assert(h <= 64);
  assert(y_step_q4 <= 32 || (y_step_q4 <= 64 && h <= 32));
  assert(x_step_q4 <= 64);

  convolve_horiz(src - src_stride * (SUBPEL_TAPS / 2 - 1), src_stride, temp, 64,
                 filter, x0_q4, x_step_q4, w, intermediate_height);
  convolve_vert(temp + 64 * (SUBPEL_TAPS / 2 - 1), 64, dst, dst_stride, filter,
                y0_q4, y_step_q4, w, h);
}